

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_common.h
# Opt level: O0

int VP8LNearLosslessBits(int near_lossless_quality)

{
  int near_lossless_quality_local;
  
  return 5 - near_lossless_quality / 0x14;
}

Assistant:

static WEBP_INLINE int VP8LNearLosslessBits(int near_lossless_quality) {
  //    100 -> 0
  // 80..99 -> 1
  // 60..79 -> 2
  // 40..59 -> 3
  // 20..39 -> 4
  //  0..19 -> 5
  return 5 - near_lossless_quality / 20;
}